

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_8x9_pixels(uint16_t *src,ptrdiff_t pitch,__m256i *sig)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*pauVar8) [16];
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  
  pauVar8 = (undefined1 (*) [16])(in_RDI + in_RSI * 0xe);
  auVar12 = *pauVar8;
  auVar10 = *pauVar8;
  pauVar8 = (undefined1 (*) [16])(in_RDI + in_RSI * 0x10);
  uVar2 = *(undefined8 *)*pauVar8;
  uVar3 = *(undefined8 *)(*pauVar8 + 8);
  auVar9 = ZEXT116(0) * auVar10 + ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(in_RDX + 0x100),0);
  auVar11 = ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(in_RDX + 0x100),0x10) + ZEXT116(1) * auVar10
  ;
  auVar1._16_8_ = in_XMM1_Qa;
  auVar1._0_16_ = auVar12;
  auVar1._24_8_ = in_XMM1_Qb;
  auVar10 = ZEXT116(0) * *pauVar8 + ZEXT116(1) * auVar12;
  auVar12 = ZEXT116(0) * auVar1._16_16_ + ZEXT116(1) * *pauVar8;
  uStack_1b0 = auVar11._0_8_;
  uStack_1a8 = auVar11._8_8_;
  uStack_1d0 = auVar12._0_8_;
  uStack_1c8 = auVar12._8_8_;
  auVar5._16_8_ = uStack_1b0;
  auVar5._0_16_ = auVar9;
  auVar5._24_8_ = uStack_1a8;
  auVar4._16_8_ = uStack_1d0;
  auVar4._0_16_ = auVar10;
  auVar4._24_8_ = uStack_1c8;
  auVar1 = vpunpcklwd_avx2(auVar5,auVar4);
  *(undefined1 (*) [32])(in_RDX + 0x60) = auVar1;
  auVar7._16_8_ = uStack_1b0;
  auVar7._0_16_ = auVar9;
  auVar7._24_8_ = uStack_1a8;
  auVar6._16_8_ = uStack_1d0;
  auVar6._0_16_ = auVar10;
  auVar6._24_8_ = uStack_1c8;
  auVar1 = vpunpckhwd_avx2(auVar7,auVar6);
  *(undefined1 (*) [32])(in_RDX + 0xe0) = auVar1;
  *(undefined8 *)(in_RDX + 0x100) = uVar2;
  *(undefined8 *)(in_RDX + 0x108) = uVar3;
  *(undefined8 *)(in_RDX + 0x110) = in_XMM1_Qa;
  *(undefined8 *)(in_RDX + 0x118) = in_XMM1_Qb;
  return;
}

Assistant:

static inline void pack_8x9_pixels(const uint16_t *src, ptrdiff_t pitch,
                                   __m256i *sig) {
  // base + 7th row
  __m256i s0 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 7 * pitch)));
  // base + 8th row
  __m256i s1 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 8 * pitch)));
  __m256i s2 = _mm256_inserti128_si256(sig[8], _mm256_castsi256_si128(s0), 1);
  __m256i s3 = _mm256_inserti128_si256(s0, _mm256_castsi256_si128(s1), 1);
  sig[3] = _mm256_unpacklo_epi16(s2, s3);
  sig[7] = _mm256_unpackhi_epi16(s2, s3);
  sig[8] = s1;
}